

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O0

void remove_pending_message_by_index(MESSAGE_SENDER_HANDLE message_sender,size_t index)

{
  ASYNC_OPERATION_HANDLE pAVar1;
  ASYNC_OPERATION_HANDLE *ppAVar2;
  size_t local_40;
  size_t local_38;
  size_t realloc_size;
  MESSAGE_WITH_CALLBACK *message_with_callback;
  ASYNC_OPERATION_HANDLE *new_messages;
  size_t index_local;
  MESSAGE_SENDER_HANDLE message_sender_local;
  
  pAVar1 = message_sender->messages[index] + 1;
  if (pAVar1->async_operation_cancel_handler != (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0) {
    message_destroy((MESSAGE_HANDLE)pAVar1->async_operation_cancel_handler);
    pAVar1->async_operation_cancel_handler = (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0;
  }
  async_operation_destroy(message_sender->messages[index]);
  if (1 < message_sender->message_count - index) {
    memmove(message_sender->messages + index,message_sender->messages + index + 1,
            ((message_sender->message_count - index) + -1) * 8);
  }
  message_sender->message_count = message_sender->message_count - 1;
  if (message_sender->message_count == 0) {
    free(message_sender->messages);
    message_sender->messages = (ASYNC_OPERATION_HANDLE *)0x0;
  }
  else {
    if (message_sender->message_count == 0) {
      local_38 = 0;
    }
    else {
      if (message_sender->message_count < 0x2000000000000000) {
        local_40 = message_sender->message_count << 3;
      }
      else {
        local_40 = 0xffffffffffffffff;
      }
      local_38 = local_40;
    }
    if ((local_38 != 0xffffffffffffffff) &&
       (ppAVar2 = (ASYNC_OPERATION_HANDLE *)realloc(message_sender->messages,local_38),
       ppAVar2 != (ASYNC_OPERATION_HANDLE *)0x0)) {
      message_sender->messages = ppAVar2;
    }
  }
  return;
}

Assistant:

static void remove_pending_message_by_index(MESSAGE_SENDER_HANDLE message_sender, size_t index)
{
    ASYNC_OPERATION_HANDLE* new_messages;
    MESSAGE_WITH_CALLBACK* message_with_callback = GET_ASYNC_OPERATION_CONTEXT(MESSAGE_WITH_CALLBACK, message_sender->messages[index]);

    if (message_with_callback->message != NULL)
    {
        message_destroy(message_with_callback->message);
        message_with_callback->message = NULL;
    }

    async_operation_destroy(message_sender->messages[index]);

    if (message_sender->message_count - index > 1)
    {
        (void)memmove(&message_sender->messages[index], &message_sender->messages[index + 1], sizeof(ASYNC_OPERATION_HANDLE) * (message_sender->message_count - index - 1));
    }

    message_sender->message_count--;

    if (message_sender->message_count > 0)
    {
        size_t realloc_size = safe_multiply_size_t(sizeof(ASYNC_OPERATION_HANDLE), (message_sender->message_count));
        if (realloc_size != SIZE_MAX &&
            (new_messages = (ASYNC_OPERATION_HANDLE*)realloc(message_sender->messages, realloc_size)) != NULL)
        {
            message_sender->messages = new_messages;
        }
    }
    else
    {
        free(message_sender->messages);
        message_sender->messages = NULL;
    }
}